

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O2

int Gia_ManAreCubeCheckTree_rec(Gia_ManAre_t *p,Gia_ObjAre_t *pObj,Gia_StaAre_t *pSta)

{
  uint uVar1;
  Gia_PtrAre_t GVar2;
  int iVar3;
  uint uVar4;
  Gia_PtrAre_t *pRoot;
  
  do {
    uVar1 = *(uint *)(&pSta[1].iPrev.field_0x0 + (*(uint *)pObj >> 2 & 0xffc));
    uVar4 = *(uint *)pObj * 2 & 0x1e;
    if ((uVar1 >> uVar4 & 1) == 0) {
      if ((uVar1 >> (sbyte)uVar4 & 2) != 0) {
        iVar3 = Gia_ObjHasBranch1(pObj);
        pRoot = pObj->F + 1;
        goto LAB_005908f0;
      }
    }
    else {
      iVar3 = Gia_ObjHasBranch0(pObj);
      pRoot = pObj->F;
LAB_005908f0:
      if (iVar3 == 0) {
        iVar3 = Gia_ManAreCubeCheckList(p,pRoot,pSta);
      }
      else {
        iVar3 = Gia_ManAreCubeCheckTree_rec
                          (p,(Gia_ObjAre_t *)
                             ((ulong)(((uint)*pRoot & 0xfffff) << 4) +
                             *(long *)((long)p->ppObjs + (ulong)((uint)*pRoot >> 0x11 & 0x3ff8))),
                           pSta);
      }
      if (iVar3 == 0) {
        return 0;
      }
    }
    iVar3 = Gia_ObjHasBranch2(pObj);
    if (iVar3 == 0) {
      iVar3 = Gia_ManAreCubeCheckList(p,pObj->F + 2,pSta);
      return iVar3;
    }
    GVar2 = pObj->F[2];
    pObj = (Gia_ObjAre_t *)
           ((ulong)(((uint)GVar2 & 0xfffff) << 4) +
           *(long *)((long)p->ppObjs + (ulong)((uint)GVar2 >> 0x11 & 0x3ff8)));
  } while( true );
}

Assistant:

int Gia_ManAreCubeCheckTree_rec( Gia_ManAre_t * p, Gia_ObjAre_t * pObj, Gia_StaAre_t * pSta )
{
    int RetValue;
    if ( Gia_StaHasValue0(pSta, pObj->iVar) )
    {
        if ( Gia_ObjHasBranch0(pObj) )
            RetValue = Gia_ManAreCubeCheckTree_rec( p, Gia_ObjNextObj0(p, pObj), pSta );
        else
            RetValue = Gia_ManAreCubeCheckList( p, pObj->F, pSta );
        if ( RetValue == 0 )
            return 0;
    }
    else if ( Gia_StaHasValue1(pSta, pObj->iVar) )
    {
        if ( Gia_ObjHasBranch1(pObj) )
            RetValue = Gia_ManAreCubeCheckTree_rec( p, Gia_ObjNextObj1(p, pObj), pSta );
        else
            RetValue = Gia_ManAreCubeCheckList( p, pObj->F + 1, pSta );
        if ( RetValue == 0 )
            return 0;
    }
    if ( Gia_ObjHasBranch2(pObj) )
        return Gia_ManAreCubeCheckTree_rec( p, Gia_ObjNextObj2(p, pObj), pSta );
    return Gia_ManAreCubeCheckList( p, pObj->F + 2, pSta );
}